

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall Printer::Printer(Printer *this,DataAttrInfo *attributes_,int attrCount_)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  DataAttrInfo *pDVar7;
  char **ppcVar8;
  int *piVar9;
  char *pcVar10;
  size_t sVar11;
  int local_80;
  int local_74;
  DataAttrInfo *local_60;
  int local_3c;
  int j;
  int bFound;
  int i_1;
  int i;
  int attrCount__local;
  DataAttrInfo *attributes__local;
  Printer *this_local;
  
  this->attrCount = attrCount_;
  uVar5 = (ulong)this->attrCount;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x44),0);
  if (SUB168(auVar1 * ZEXT816(0x44),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pDVar7 = (DataAttrInfo *)operator_new__(uVar6);
  if (uVar5 != 0) {
    local_60 = pDVar7;
    do {
      DataAttrInfo::DataAttrInfo(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != pDVar7 + uVar5);
  }
  this->attributes = pDVar7;
  for (bFound = 0; bFound < this->attrCount; bFound = bFound + 1) {
    DataAttrInfo::operator=(this->attributes + bFound,attributes_ + bFound);
  }
  this->iCount = 0;
  ppcVar8 = (char **)malloc((long)this->attrCount << 3);
  this->psHeader = ppcVar8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->attrCount;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar9 = (int *)operator_new__(uVar5);
  this->spaces = piVar9;
  j = 0;
  do {
    if (this->attrCount <= j) {
      return;
    }
    bVar3 = false;
    pcVar10 = (char *)operator_new__(0x35);
    this->psHeader[j] = pcVar10;
    memset(this->psHeader[j],0,0x35);
    for (local_3c = 0; local_3c < this->attrCount; local_3c = local_3c + 1) {
      if (local_3c != j) {
        iVar4 = strcmp(this->attributes[j].attrName,this->attributes[local_3c].attrName);
        if (iVar4 == 0) {
          bVar3 = true;
          break;
        }
      }
    }
    if (bVar3) {
      sprintf(this->psHeader[j],"%s.%s",this->attributes + j,this->attributes[j].attrName);
    }
    else {
      strcpy(this->psHeader[j],this->attributes[j].attrName);
    }
    if (this->attributes[j].attrType == STRING) {
      if (this->attributes[j].attrLength < 0x35) {
        local_74 = this->attributes[j].attrLength;
      }
      else {
        local_74 = 0x35;
      }
      this->spaces[j] = local_74;
    }
    else {
      sVar11 = strlen(this->psHeader[j]);
      if (sVar11 < 0xc) {
        local_80 = 0xc;
      }
      else {
        sVar11 = strlen(this->psHeader[j]);
        local_80 = (int)sVar11;
      }
      this->spaces[j] = local_80;
    }
    sVar11 = strlen(this->psHeader[j]);
    this->spaces[j] = this->spaces[j] - (int)sVar11;
    if (this->spaces[j] < 1) {
      this->spaces[j] = 0;
      strcat(this->psHeader[j]," ");
    }
    j = j + 1;
  } while( true );
}

Assistant:

Printer::Printer(const DataAttrInfo *attributes_, const int attrCount_)
{
    attrCount = attrCount_;
    attributes = new DataAttrInfo[attrCount];

    for (int i=0; i < attrCount; i++)
        attributes[i] = attributes_[i];

    // Number of tuples printed
    iCount = 0;

    // Figure out what the header information will look like.  Normally,
    // we can just use the attribute name, but if that appears more than
    // once, then we should use "relation.attribute".

    // this line broke when using CC
    // changing to use malloc and free instead of new and delete
    // psHeader = (char **) new (char *)[attrCount];
    psHeader = (char**)malloc(attrCount * sizeof(char*));

    // Also figure out the number of spaces between each attribute
    spaces = new int[attrCount];

    for (int i=0; i < attrCount; i++ ) {
        // Try to find the attribute in another column
        int bFound = 0;
        psHeader[i] = new char[MAXPRINTSTRING];
        memset(psHeader[i],0,MAXPRINTSTRING);

        for (int j=0; j < attrCount; j++)
            if (j != i &&
                strcmp(attributes[i].attrName,
                       attributes[j].attrName) == 0) {
                bFound = 1;
                break;
            }

        if (bFound)
            sprintf(psHeader[i], "%s.%s",
                    attributes[i].relName, attributes[i].attrName);
        else
            strcpy(psHeader[i], attributes[i].attrName);

        if (attributes[i].attrType==STRING)
            spaces[i] = min(attributes[i].attrLength, MAXPRINTSTRING);
        else
            spaces[i] = max(12, strlen(psHeader[i]));

        // We must subtract out those characters that will be for the
        // header.
        spaces[i] -= strlen(psHeader[i]);

        // If there are negative (or zero) spaces, then insert a single
        // space.
        if (spaces[i] < 1) {
            // The psHeader will give us the space we need
            spaces[i] = 0;
            strcat(psHeader[i]," ");
        }
    }
}